

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_integer(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  basic_variable<std::allocator<char>_> *local_d40;
  basic_variable<std::allocator<char>_> *local_d28;
  basic_variable<std::allocator<char>_> *local_d10;
  basic_variable<std::allocator<char>_> *local_cf8;
  basic_variable<std::allocator<char>_> *local_ce0;
  basic_variable<std::allocator<char>_> *local_cc8;
  basic_variable<std::allocator<char>_> *local_cb0;
  basic_variable<std::allocator<char>_> *local_c98;
  undefined1 local_c89;
  basic_variable<std::allocator<char>_> local_c88;
  basic_variable<std::allocator<char>_> *local_c50;
  basic_variable<std::allocator<char>_> local_c48;
  basic_variable<std::allocator<char>_> local_c18;
  basic_variable<std::allocator<char>_> local_be8;
  undefined1 local_bb8 [77];
  undefined1 local_b6b [2];
  undefined1 local_b69;
  basic_variable<std::allocator<char>_> local_b68;
  basic_variable<std::allocator<char>_> *local_b30;
  basic_variable<std::allocator<char>_> local_b28;
  basic_variable<std::allocator<char>_> local_af8;
  basic_variable<std::allocator<char>_> local_ac8;
  undefined1 local_a98 [77];
  undefined1 local_a4b [2];
  undefined1 local_a49;
  basic_variable<std::allocator<char>_> local_a48;
  basic_variable<std::allocator<char>_> *local_a10;
  basic_variable<std::allocator<char>_> local_a08;
  basic_variable<std::allocator<char>_> local_9d8;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_978 [77];
  undefined1 local_92b [2];
  undefined1 local_929;
  basic_variable<std::allocator<char>_> local_928;
  basic_variable<std::allocator<char>_> *local_8f0;
  basic_variable<std::allocator<char>_> local_8e8;
  basic_variable<std::allocator<char>_> local_8b8;
  basic_variable<std::allocator<char>_> local_888;
  undefined1 local_858 [77];
  undefined1 local_80b [2];
  undefined1 local_809;
  basic_variable<std::allocator<char>_> local_808;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_79b [2];
  undefined1 local_799;
  basic_variable<std::allocator<char>_> local_798;
  basic_variable<std::allocator<char>_> local_768;
  undefined1 local_72b [2];
  undefined1 local_729;
  basic_variable<std::allocator<char>_> local_728;
  basic_variable<std::allocator<char>_> local_6f8;
  undefined1 local_6bb [2];
  undefined1 local_6b9;
  basic_variable<std::allocator<char>_> local_6b8;
  basic_variable<std::allocator<char>_> local_688;
  undefined1 local_656 [2];
  undefined4 local_654;
  undefined4 local_650;
  uint big_1;
  uint zero_1;
  basic_variable<std::allocator<char>_> *local_610;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_578 [77];
  undefined1 local_52b [2];
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> *local_4f0;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  basic_variable<std::allocator<char>_> local_488;
  undefined1 local_458 [77];
  undefined1 local_40b [2];
  undefined1 local_409;
  basic_variable<std::allocator<char>_> local_408;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_338 [77];
  undefined1 local_2eb [2];
  undefined1 local_2e9;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> *local_2b0;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  undefined4 local_10;
  undefined4 local_c;
  int big;
  int zero;
  
  local_c = 0;
  local_10 = 0x7fffffff;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,0);
  local_12[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc72,"void equality_suite::compare_array_equal_integer()",local_12,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_e8,0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc73,"void equality_suite::compare_array_equal_integer()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,0x7fffffff);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc74,"void equality_suite::compare_array_equal_integer()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1c8,0x7fffffff);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  sVar1 = 0xc75;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc75,"void equality_suite::compare_array_equal_integer()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_2b0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,1);
  local_2b0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,2);
  local_2b0 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,3);
  local_218._0_8_ = &local_2a8;
  local_218._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_array<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2e8,0);
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2e8);
  local_2e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc77,"void equality_suite::compare_array_equal_integer()",local_1cb,&local_2e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  pbVar2 = &local_2a8;
  local_c98 = (basic_variable<std::allocator<char>_> *)local_218;
  do {
    local_c98 = local_c98 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_c98);
  } while (local_c98 != pbVar2);
  local_3d0 = &local_3c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,1);
  local_3d0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,2);
  local_3d0 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,3);
  local_338._0_8_ = &local_3c8;
  local_338._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),
             (basic_array<std::allocator<char>_> *)local_338._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_408,0);
  local_2eb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),&local_408);
  local_409 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc78,"void equality_suite::compare_array_equal_integer()",local_2eb,&local_409);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  pbVar2 = &local_3c8;
  local_cb0 = (basic_variable<std::allocator<char>_> *)local_338;
  do {
    local_cb0 = local_cb0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cb0);
  } while (local_cb0 != pbVar2);
  local_4f0 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,1);
  local_4f0 = &local_4b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,2);
  local_4f0 = &local_488;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,3);
  local_458._0_8_ = &local_4e8;
  local_458._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),
             (basic_array<std::allocator<char>_> *)local_458._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_528,0x7fffffff);
  local_40b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),&local_528);
  local_529 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc79,"void equality_suite::compare_array_equal_integer()",local_40b,&local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10));
  pbVar2 = &local_4e8;
  local_cc8 = (basic_variable<std::allocator<char>_> *)local_458;
  do {
    local_cc8 = local_cc8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cc8);
  } while (local_cc8 != pbVar2);
  local_610 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,1);
  local_610 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,2);
  local_610 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,3);
  local_578._0_8_ = &local_608;
  local_578._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),
             (basic_array<std::allocator<char>_> *)local_578._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&zero_1,0x7fffffff);
  local_52b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),
                            (basic_variable<std::allocator<char>_> *)&zero_1);
  big_1._3_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc7a,"void equality_suite::compare_array_equal_integer()",local_52b,(long)&big_1 + 3)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&zero_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10));
  local_ce0 = (basic_variable<std::allocator<char>_> *)local_578;
  do {
    local_ce0 = local_ce0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ce0);
  } while (local_ce0 != &local_608);
  local_650 = 0;
  local_654 = 0xffffffff;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_6b8,0);
  local_656[0] = trial::dynamic::operator==(&local_688,&local_6b8);
  local_6b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc80,"void equality_suite::compare_array_equal_integer()",local_656,&local_6b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_728,0);
  local_6bb[0] = trial::dynamic::operator!=(&local_6f8,&local_728);
  local_729 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc81,"void equality_suite::compare_array_equal_integer()",local_6bb,&local_729);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6f8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_798,0xffffffff);
  local_72b[0] = trial::dynamic::operator==(&local_768,&local_798);
  local_799 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc82,"void equality_suite::compare_array_equal_integer()",local_72b,&local_799);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_808,0xffffffff);
  local_79b[0] = trial::dynamic::operator!=(&local_7d8,&local_808);
  local_809 = 1;
  sVar1 = 0xc83;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc83,"void equality_suite::compare_array_equal_integer()",local_79b,&local_809);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_808);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  local_8f0 = &local_8e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8f0,1);
  local_8f0 = &local_8b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8f0,2);
  local_8f0 = &local_888;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8f0,3);
  local_858._0_8_ = &local_8e8;
  local_858._8_8_ = 3;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_858 + 0x10),
             (basic_array<std::allocator<char>_> *)local_858._0_8_,init_03);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_928,0);
  local_80b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_858 + 0x10),&local_928);
  local_929 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc85,"void equality_suite::compare_array_equal_integer()",local_80b,&local_929);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_858 + 0x10));
  pbVar2 = &local_8e8;
  local_cf8 = (basic_variable<std::allocator<char>_> *)local_858;
  do {
    local_cf8 = local_cf8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_cf8);
  } while (local_cf8 != pbVar2);
  local_a10 = &local_a08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a10,1);
  local_a10 = &local_9d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a10,2);
  local_a10 = &local_9a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a10,3);
  local_978._0_8_ = &local_a08;
  local_978._8_8_ = 3;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (basic_array<std::allocator<char>_> *)local_978._0_8_,init_04);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_a48,0);
  local_92b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),&local_a48);
  local_a49 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc86,"void equality_suite::compare_array_equal_integer()",local_92b,&local_a49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  pbVar2 = &local_a08;
  local_d10 = (basic_variable<std::allocator<char>_> *)local_978;
  do {
    local_d10 = local_d10 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d10);
  } while (local_d10 != pbVar2);
  local_b30 = &local_b28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b30,1);
  local_b30 = &local_af8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b30,2);
  local_b30 = &local_ac8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b30,3);
  local_a98._0_8_ = &local_b28;
  local_a98._8_8_ = 3;
  init_05._M_len = (size_type)pbVar2;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a98._0_8_,init_05);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_b68,0xffffffff);
  local_a4b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10),&local_b68);
  local_b69 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc87,"void equality_suite::compare_array_equal_integer()",local_a4b,&local_b69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10));
  pbVar2 = &local_b28;
  local_d28 = (basic_variable<std::allocator<char>_> *)local_a98;
  do {
    local_d28 = local_d28 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d28);
  } while (local_d28 != pbVar2);
  local_c50 = &local_c48;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c50,1);
  local_c50 = &local_c18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c50,2);
  local_c50 = &local_be8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c50,3);
  local_bb8._0_8_ = &local_c48;
  local_bb8._8_8_ = 3;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_bb8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_bb8._0_8_,init_06);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_c88,0xffffffff);
  local_b6b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_bb8 + 0x10),&local_c88);
  local_c89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc88,"void equality_suite::compare_array_equal_integer()",local_b6b,&local_c89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_bb8 + 0x10));
  local_d40 = (basic_variable<std::allocator<char>_> *)local_bb8;
  do {
    local_d40 = local_d40 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d40);
  } while (local_d40 != &local_c48);
  return;
}

Assistant:

void compare_array_equal_integer()
{
    {
        const auto zero = 0;
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(big), true);
    }
    {
        const auto zero = 0U;
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(big), true);
    }
}